

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::InstanceBodySymbol&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,InstanceBodySymbol *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  InstanceSymbol *pIVar4;
  
  pIVar4 = (InstanceSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceSymbol *)this->endPtr < pIVar4 + 1) {
    pIVar4 = (InstanceSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pIVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar2;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.name._M_str = pcVar3;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.location = SVar1;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pIVar4->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (pIVar4->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  pIVar4->body = args_2;
  pIVar4->resolvedConfig = (ResolvedConfig *)0x0;
  pIVar4->connectionMap = (PointerMap *)0x0;
  (pIVar4->connections)._M_ptr = (pointer)0x0;
  (pIVar4->connections)._M_extent._M_extent_value = 0;
  pIVar4->canonicalBody = (InstanceBodySymbol *)0x0;
  args_2->parentInstance = pIVar4;
  return pIVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }